

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::WriteEquals
          (WrapperFieldGenerator *this,Printer *printer)

{
  long lVar1;
  size_t sVar2;
  char *__s;
  string_view text;
  
  lVar1 = google::protobuf::FieldDescriptor::message_type();
  if (0 < *(int *)(lVar1 + 4)) {
    if (*(char *)(*(long *)(lVar1 + 0x38) + 2) == '\x02') {
      __s = 
      "if (!pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n"
      ;
    }
    else {
      lVar1 = google::protobuf::FieldDescriptor::message_type();
      if (*(int *)(lVar1 + 4) < 1) goto LAB_00241814;
      __s = "if ($property_name$ != other.$property_name$) return false;\n";
      if (*(char *)(*(long *)(lVar1 + 0x38) + 2) == '\x01') {
        __s = 
        "if (!pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n"
        ;
      }
    }
    sVar2 = strlen(__s);
    text._M_str = __s;
    text._M_len = sVar2;
    io::Printer::
    Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&(this->super_FieldGeneratorBase).variables_,text);
    return;
  }
  WriteEquals();
LAB_00241814:
  WriteEquals();
  return;
}

Assistant:

void WrapperFieldGenerator::WriteEquals(io::Printer* printer) {
  const char *text = "if ($property_name$ != other.$property_name$) return false;\n";
  if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_FLOAT) {
    text = "if (!pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n";
  }
  else if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_DOUBLE) {
    text = "if (!pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n";
  }
  printer->Print(variables_, text);
}